

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void jsonnet::internal::remove_initial_newlines(AST *ast)

{
  const_iterator __position;
  AST *pAVar1;
  
  pAVar1 = left_recursive_deep(ast);
  while ((__position._M_current =
               (pAVar1->openFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start,
         (pAVar1->openFodder).
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_finish != __position._M_current &&
         ((__position._M_current)->kind == LINE_END))) {
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::erase(&pAVar1->openFodder,__position);
  }
  return;
}

Assistant:

static Fodder &open_fodder(AST *ast_)
{
    return left_recursive_deep(ast_)->openFodder;
}